

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Clunk.cpp
# Opt level: O0

uint64_t __thiscall clunk::Node::PerftSearch<false>(Node *this,int depth)

{
  int iVar1;
  bool bVar2;
  uint64_t uVar3;
  Move *move;
  uint64_t count;
  int depth_local;
  Node *this_local;
  
  GenerateMoves<false,false>(this,depth);
  DAT_001aab60 = this->moveCount + DAT_001aab60;
  if ((this->child == (Node *)0x0) || (depth < 2)) {
    this_local = (Node *)(long)this->moveCount;
  }
  else {
    move = (Move *)0x0;
    while( true ) {
      bVar2 = false;
      if (_stop == 0) {
        bVar2 = this->moveIndex < this->moveCount;
      }
      if (!bVar2) break;
      iVar1 = this->moveIndex;
      this->moveIndex = iVar1 + 1;
      Exec<false>(this,this->moves + iVar1,this->child);
      uVar3 = PerftSearch<true>(this->child,depth + -1);
      move = (Move *)((long)&move->bits + uVar3);
      Undo<false>(this,this->moves + iVar1);
    }
    this_local = (Node *)move;
  }
  return (uint64_t)this_local;
}

Assistant:

uint64_t PerftSearch(const int depth) {
    GenerateMoves<color, false>(depth);
    _stats.snodes += moveCount;
    if (!child || (depth <= 1)) {
      return moveCount;
    }

    uint64_t count = 0;
    while (!_stop && (moveIndex < moveCount)) {
      const Move& move = moves[moveIndex++];
      Exec<color>(move, *child);
      count += child->PerftSearch<!color>(depth - 1);
      Undo<color>(move);
    }
    return count;
  }